

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop_time.c
# Opt level: O3

timepoint_precision_t parse_timepoint_precision(char *value)

{
  char cVar1;
  
  cVar1 = *value;
  if (cVar1 == '1') {
    if (value[1] == '\0') {
      return TP_EXACT;
    }
  }
  else if ((cVar1 == '0') && (value[1] == '\0')) {
    return TP_APPROXIMATE;
  }
  return TP_NOT_SET - (cVar1 == '\0');
}

Assistant:

timepoint_precision_t parse_timepoint_precision(const char *value) {
    if (strcmp(value, "0") == 0)
        return TP_APPROXIMATE;
    else if (strcmp(value, "1") == 0 || strcmp(value, "") == 0)
        return TP_EXACT;
    else
        return TP_NOT_SET;
}